

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inclusive_scan.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this;
  size_t i;
  size_type sVar4;
  size_type __n;
  Executor *this_00;
  vector<int,_std::allocator<int>_> elements;
  Future<void> local_278;
  vector<int,_std::allocator<int>_> scan_par;
  vector<int,_std::allocator<int>_> scan_seq;
  shared_ptr<tf::WorkerInterface> local_228;
  Taskflow taskflow;
  Executor executor;
  
  if (argc != 3) {
    std::operator<<((ostream *)&std::cerr,"usage: ./inclusive_scan num_workers num_elements\n");
    exit(1);
  }
  iVar1 = atoi(argv[1]);
  iVar2 = atoi(argv[2]);
  local_228.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_228.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(long)iVar1,&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  __n = (size_type)iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&elements,__n,(allocator_type *)&local_278);
  std::vector<int,_std::allocator<int>_>::vector(&scan_seq,__n,(allocator_type *)&local_278);
  std::vector<int,_std::allocator<int>_>::vector(&scan_par,__n,(allocator_type *)&local_278);
  for (sVar4 = 0; __n != sVar4; sVar4 = sVar4 + 1) {
    elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar4] = (int)sVar4;
  }
  std::operator<<((ostream *)&std::cout,"sequential inclusive scan ... ");
  std::chrono::_V2::steady_clock::now();
  std::
  inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::multiplies<int>>
            (elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar3,"ns\n");
  std::operator<<((ostream *)&std::cout,"parallel   inclusive scan ... ");
  std::chrono::_V2::steady_clock::now();
  tf::FlowBuilder::
  inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::multiplies<int>>
            ((FlowBuilder *)&local_278,&taskflow,
             elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  this_00 = &executor;
  tf::Executor::run(&local_278,this_00,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_278,this_00);
  tf::Future<void>::~Future(&local_278);
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar3,"ns\n");
  sVar4 = 0;
  while( true ) {
    if (__n == sVar4) {
      puts("correct result");
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&scan_par.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&scan_seq.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&elements.super__Vector_base<int,_std::allocator<int>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return 0;
    }
    if (scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar4] !=
        scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar4]) break;
    sVar4 = sVar4 + 1;
  }
  printf("scan_seq[%zu]=%d..., scan_par[%zu]=%d...\n",sVar4);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"incorrect result");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 3) {
    std::cerr << "usage: ./inclusive_scan num_workers num_elements\n"; 
    std::exit(EXIT_FAILURE);
  }

  size_t W = std::atoi(argv[1]);
  size_t N = std::atoi(argv[2]);

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> elements(N), scan_seq(N), scan_par(N);
  for(size_t i=0; i<N; i++) {
    elements[i] = static_cast<int>(i);
  }
  
  // sequential inclusive scan
  {
    std::cout << "sequential inclusive scan ... ";
    auto beg = std::chrono::steady_clock::now();
    std::inclusive_scan(
      elements.begin(), elements.end(), scan_seq.begin(), std::multiplies<int>{}
    );
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(end-beg).count()
              << "ns\n";
  }

  // create a parallel inclusive scan task
  {
    std::cout << "parallel   inclusive scan ... ";
    auto beg = std::chrono::steady_clock::now();
    taskflow.inclusive_scan(
      elements.begin(), elements.end(), scan_par.begin(), std::multiplies<int>{}
    );
    executor.run(taskflow).wait();
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(end-beg).count()
              << "ns\n";
  }

  // verify the result
  for(size_t i=0; i<N; i++) {
    if(scan_seq[i] != scan_par[i]) {
      printf(
        "scan_seq[%zu]=%d..., scan_par[%zu]=%d...\n",
        i, scan_seq[i], i, scan_par[i]
      );
      throw std::runtime_error("incorrect result");
    }
  }

  printf("correct result\n");

  return 0;
}